

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O1

void __thiscall leveldb::VersionEdit::~VersionEdit(VersionEdit *this)

{
  pointer pcVar1;
  
  std::
  vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
  ::~vector(&this->new_files_);
  std::
  _Rb_tree<std::pair<int,_unsigned_long>,_std::pair<int,_unsigned_long>,_std::_Identity<std::pair<int,_unsigned_long>_>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  ::_M_erase(&(this->deleted_files_)._M_t,
             (_Link_type)
             (this->deleted_files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ::~vector(&this->compact_pointers_);
  pcVar1 = (this->comparator_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->comparator_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~VersionEdit() = default;